

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVector.cpp
# Opt level: O3

bool __thiscall celero::TestVector::containsGroup(TestVector *this,string *x)

{
  _Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
  __mutex;
  _Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_> _Var1
  ;
  shared_ptr<celero::Benchmark> *psVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  __normal_iterator<const_std::shared_ptr<celero::Benchmark>_*,_std::vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>_>
  __it;
  __normal_iterator<const_std::shared_ptr<celero::Benchmark>_*,_std::vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>_>
  __it_00;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  _Head_base<0UL,_celero::TestVector::Impl_*,_false> local_98;
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  __mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl =
       (this->pimpl)._pimpl._M_t.
       super___uniq_ptr_impl<celero::TestVector::Impl,_std::default_delete<celero::TestVector::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
       .super__Head_base<0UL,_celero::TestVector::Impl_*,_false>;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)
                             __mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>.
                             _M_head_impl);
  if (iVar5 != 0) {
    uVar6 = std::__throw_system_error(iVar5);
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)local_98._M_head_impl);
    _Unwind_Resume(uVar6);
  }
  _Var1.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl =
       (this->pimpl)._pimpl._M_t.
       super___uniq_ptr_impl<celero::TestVector::Impl,_std::default_delete<celero::TestVector::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
       .super__Head_base<0UL,_celero::TestVector::Impl_*,_false>;
  __it_00._M_current =
       *(shared_ptr<celero::Benchmark> **)
        ((long)_Var1.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl + 0x28);
  psVar2 = *(shared_ptr<celero::Benchmark> **)
            ((long)_Var1.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl +
            0x30);
  local_90 = local_80;
  pcVar3 = (x->_M_dataplus)._M_p;
  local_98 = __mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar3,pcVar3 + x->_M_string_length)
  ;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_90,local_88 + (long)local_90);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_70,local_68 + (long)local_70);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_b8,local_b0 + (long)local_b8);
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_50,local_48 + (long)local_50);
  lVar8 = (long)psVar2 - (long)__it_00._M_current;
  if (0 < lVar8 >> 6) {
    lVar7 = (lVar8 >> 6) + 1;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                          *)&local_b8,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar4) goto LAB_0013448c;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                          *)&local_b8,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar4) goto LAB_0013448c;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                          *)&local_b8,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar4) goto LAB_0013448c;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                          *)&local_b8,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar4) goto LAB_0013448c;
      __it_00._M_current = __it_00._M_current + 4;
      lVar7 = lVar7 + -1;
      lVar8 = lVar8 + -0x40;
    } while (1 < lVar7);
  }
  lVar8 = lVar8 >> 4;
  if (lVar8 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar8 != 2) {
      __it._M_current = psVar2;
      if ((lVar8 != 3) ||
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>
                  ::operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                                *)&local_b8,__it_00), __it._M_current = __it_00._M_current, bVar4))
      goto LAB_0013448c;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                        *)&local_b8,__it);
    if (bVar4) goto LAB_0013448c;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar4 = __gnu_cxx::__ops::
          _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
          operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                      *)&local_b8,__it_00);
  __it._M_current = psVar2;
  if (bVar4) {
    __it._M_current = __it_00._M_current;
  }
LAB_0013448c:
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  psVar2 = *(shared_ptr<celero::Benchmark> **)
            ((long)(this->pimpl)._pimpl._M_t.
                   super___uniq_ptr_impl<celero::TestVector::Impl,_std::default_delete<celero::TestVector::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
                   .super__Head_base<0UL,_celero::TestVector::Impl_*,_false> + 0x30);
  pthread_mutex_unlock((pthread_mutex_t *)local_98._M_head_impl);
  return __it._M_current != psVar2;
}

Assistant:

bool TestVector::containsGroup(const std::string& x) const
{
	std::lock_guard<std::mutex> mutexLock(this->pimpl->testVectorMutex);

	const auto found = std::find_if(std::begin(this->pimpl->testVector), std::end(this->pimpl->testVector),
									[x](std::shared_ptr<Benchmark> const& bmark) -> bool { return (bmark->getName() == x); });

	return found != std::end(this->pimpl->testVector);
}